

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void __thiscall l2r_lr_fun::Hv(l2r_lr_fun *this,double *s,double *Hs)

{
  int iVar1;
  uint uVar2;
  Reduce_Vectors *this_00;
  double **ppdVar3;
  feature_node **ppfVar4;
  double *pdVar5;
  double *pdVar6;
  feature_node *pfVar7;
  double *pdVar8;
  feature_node *pfVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  double dVar16;
  
  iVar14 = this->prob->l;
  lVar15 = (long)iVar14;
  uVar10 = (*(this->super_function)._vptr_function[3])();
  uVar13 = 0xffffffffffffffff;
  if (-1 < lVar15) {
    uVar13 = lVar15 * 8;
  }
  pvVar11 = operator_new__(uVar13);
  this_00 = this->reduce_vectors;
  iVar1 = this_00->size;
  if (0 < (long)iVar1) {
    uVar2 = this_00->nr_thread;
    ppdVar3 = this_00->tmp_array;
    lVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar13 = 0;
        do {
          ppdVar3[uVar13][lVar12] = 0.0;
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar1);
  }
  if (0 < iVar14) {
    ppfVar4 = this->prob->x;
    pdVar5 = this->C;
    pdVar6 = this->D;
    lVar12 = 0;
    do {
      pfVar7 = ppfVar4[lVar12];
      *(undefined8 *)((long)pvVar11 + lVar12 * 8) = 0;
      iVar14 = pfVar7->index;
      if (iVar14 != -1) {
        dVar16 = *(double *)((long)pvVar11 + lVar12 * 8);
        pfVar9 = pfVar7;
        do {
          dVar16 = dVar16 + s[(long)iVar14 + -1] * pfVar9->value;
          *(double *)((long)pvVar11 + lVar12 * 8) = dVar16;
          iVar14 = pfVar9[1].index;
          pfVar9 = pfVar9 + 1;
        } while (iVar14 != -1);
      }
      dVar16 = pdVar5[lVar12] * pdVar6[lVar12] * *(double *)((long)pvVar11 + lVar12 * 8);
      *(double *)((long)pvVar11 + lVar12 * 8) = dVar16;
      iVar14 = pfVar7->index;
      if (iVar14 != -1) {
        pdVar8 = this_00->tmp_array[1];
        do {
          pdVar8[(long)iVar14 + -1] = pfVar7->value * dVar16 + pdVar8[(long)iVar14 + -1];
          iVar14 = pfVar7[1].index;
          pfVar7 = pfVar7 + 1;
        } while (iVar14 != -1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar15);
  }
  Reduce_Vectors::reduce_sum(this_00,Hs);
  if (0 < (int)uVar10) {
    uVar13 = 0;
    do {
      Hs[uVar13] = s[uVar13] + Hs[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  operator_delete__(pvVar11);
  return;
}

Assistant:

void l2r_lr_fun::Hv(double *s, double *Hs)
{
	int i;
	int l=prob->l;
	int w_size=get_nr_variable();
	double *wa = new double[l];

	reduce_vectors->init();

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *xi=prob->x[i];
		wa[i] = 0;
		while(xi->index != -1)
		{
			wa[i] += s[xi->index-1]*xi->value;
			xi++;
		}
		wa[i] = C[i]*D[i]*wa[i];
	
		reduce_vectors->sum_scale_x(wa[i], prob->x[i]);
	}

	reduce_vectors->reduce_sum(Hs);
	for(i=0;i<w_size;i++)
		Hs[i] = s[i] + Hs[i];
	delete[] wa;
}